

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

void add_intrinsic_f_Vf(Context_conflict *ctx,char *fn)

{
  int iVar1;
  MOJOSHADER_astDataType *pMVar2;
  MOJOSHADER_astDataType *pMVar3;
  void *value;
  MOJOSHADER_astDataType *local_20;
  
  iVar1 = hash_find((ctx->usertypes).hash,"float1",&local_20);
  if ((iVar1 == 0) || (local_20 == (MOJOSHADER_astDataType *)0x0)) {
    local_20 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_20 = (MOJOSHADER_astDataType *)(local_20->structure).members;
  }
  pMVar2 = build_function_datatype
                     (ctx,(MOJOSHADER_astDataType *)((local_20->structure).members)->identifier,1,
                      &local_20,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float2",&local_20);
  if (iVar1 != 0) {
    if (local_20 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (MOJOSHADER_astDataType *)(local_20->structure).members;
    }
  }
  local_20 = pMVar3;
  pMVar2 = build_function_datatype
                     (ctx,(MOJOSHADER_astDataType *)((pMVar3->structure).members)->identifier,1,
                      &local_20,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float3",&local_20);
  if (iVar1 != 0) {
    if (local_20 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (MOJOSHADER_astDataType *)(local_20->structure).members;
    }
  }
  local_20 = pMVar3;
  pMVar2 = build_function_datatype
                     (ctx,(MOJOSHADER_astDataType *)((pMVar3->structure).members)->identifier,1,
                      &local_20,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float4",&local_20);
  if (iVar1 != 0) {
    if (local_20 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (MOJOSHADER_astDataType *)(local_20->structure).members;
    }
  }
  local_20 = pMVar3;
  pMVar2 = build_function_datatype
                     (ctx,(MOJOSHADER_astDataType *)((pMVar3->structure).members)->identifier,1,
                      &local_20,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half1",&local_20);
  if (iVar1 != 0) {
    if (local_20 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (MOJOSHADER_astDataType *)(local_20->structure).members;
    }
  }
  local_20 = pMVar3;
  pMVar2 = build_function_datatype
                     (ctx,(MOJOSHADER_astDataType *)((pMVar3->structure).members)->identifier,1,
                      &local_20,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half2",&local_20);
  if (iVar1 != 0) {
    if (local_20 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (MOJOSHADER_astDataType *)(local_20->structure).members;
    }
  }
  local_20 = pMVar3;
  pMVar2 = build_function_datatype
                     (ctx,(MOJOSHADER_astDataType *)((pMVar3->structure).members)->identifier,1,
                      &local_20,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half3",&local_20);
  if (iVar1 != 0) {
    if (local_20 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (MOJOSHADER_astDataType *)(local_20->structure).members;
    }
  }
  local_20 = pMVar3;
  pMVar2 = build_function_datatype
                     (ctx,(MOJOSHADER_astDataType *)((pMVar3->structure).members)->identifier,1,
                      &local_20,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half4",&local_20);
  if (iVar1 != 0) {
    if (local_20 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (MOJOSHADER_astDataType *)(local_20->structure).members;
    }
  }
  local_20 = pMVar3;
  pMVar2 = build_function_datatype
                     (ctx,(MOJOSHADER_astDataType *)((pMVar3->structure).members)->identifier,1,
                      &local_20,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double1",&local_20);
  if (iVar1 != 0) {
    if (local_20 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (MOJOSHADER_astDataType *)(local_20->structure).members;
    }
  }
  local_20 = pMVar3;
  pMVar2 = build_function_datatype
                     (ctx,(MOJOSHADER_astDataType *)((pMVar3->structure).members)->identifier,1,
                      &local_20,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double2",&local_20);
  if (iVar1 != 0) {
    if (local_20 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (MOJOSHADER_astDataType *)(local_20->structure).members;
    }
  }
  local_20 = pMVar3;
  pMVar2 = build_function_datatype
                     (ctx,(MOJOSHADER_astDataType *)((pMVar3->structure).members)->identifier,1,
                      &local_20,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double3",&local_20);
  if (iVar1 != 0) {
    if (local_20 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (MOJOSHADER_astDataType *)(local_20->structure).members;
    }
  }
  local_20 = pMVar3;
  pMVar2 = build_function_datatype
                     (ctx,(MOJOSHADER_astDataType *)((pMVar3->structure).members)->identifier,1,
                      &local_20,1);
  pMVar3 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double4",&local_20);
  if (iVar1 != 0) {
    if (local_20 == (MOJOSHADER_astDataType *)0x0) {
      pMVar3 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar3 = (MOJOSHADER_astDataType *)(local_20->structure).members;
    }
  }
  local_20 = pMVar3;
  pMVar3 = build_function_datatype
                     (ctx,(MOJOSHADER_astDataType *)((pMVar3->structure).members)->identifier,1,
                      &local_20,1);
  push_function(ctx,fn,pMVar3,0);
  return;
}

Assistant:

static void add_intrinsic_f_Vf(Context *ctx, const char *fn)
{
    ADD_INTRINSIC_VECTOR_FLOAT(add_intrinsic1(ctx, fn, dt->user.details->vector.base, dt));
}